

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonObjectFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  uint uVar2;
  long lVar3;
  sqlite3_value *psVar4;
  Mem *pMVar5;
  u32 N;
  uchar *zIn;
  long lVar6;
  long in_FS_OFFSET;
  JsonString jx;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if ((argc & 1U) == 0) {
    jx.zBuf = jx.zSpace;
    jx.nAlloc = 100;
    jx.nUsed = 0;
    jx.bStatic = '\x01';
    jx.bErr = '\0';
    jx.pCtx = ctx;
    jsonAppendChar(&jx,'{');
    for (lVar6 = 0; lVar6 < argc; lVar6 = lVar6 + 2) {
      psVar4 = argv[lVar6];
      uVar2._0_2_ = psVar4->flags;
      uVar2._2_1_ = psVar4->enc;
      uVar2._3_1_ = psVar4->eSubtype;
      if ((0x4000400040004U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        sqlite3_result_error(ctx,"json_object() labels must be TEXT",-1);
        jsonReset(&jx);
        goto LAB_0018ab42;
      }
      jsonAppendSeparator(&jx);
      zIn = sqlite3_value_text(argv[lVar6]);
      N = sqlite3_value_bytes(argv[lVar6]);
      jsonAppendString(&jx,(char *)zIn,N);
      jsonAppendChar(&jx,':');
      jsonAppendValue(&jx,argv[lVar6 + 1]);
    }
    jsonAppendChar(&jx,'}');
    jsonResult(&jx);
    pMVar5 = ctx->pOut;
    pMVar5->eSubtype = 'J';
    pbVar1 = (byte *)((long)&pMVar5->flags + 1);
    *pbVar1 = *pbVar1 | 8;
LAB_0018ab42:
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    sqlite3_result_error(ctx,"json_object() requires an even number of arguments",-1);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void jsonObjectFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;
  const char *z;
  u32 n;

  if( argc&1 ){
    sqlite3_result_error(ctx, "json_object() requires an even number "
                                  "of arguments", -1);
    return;
  }
  jsonInit(&jx, ctx);
  jsonAppendChar(&jx, '{');
  for(i=0; i<argc; i+=2){
    if( sqlite3_value_type(argv[i])!=SQLITE_TEXT ){
      sqlite3_result_error(ctx, "json_object() labels must be TEXT", -1);
      jsonReset(&jx);
      return;
    }
    jsonAppendSeparator(&jx);
    z = (const char*)sqlite3_value_text(argv[i]);
    n = (u32)sqlite3_value_bytes(argv[i]);
    jsonAppendString(&jx, z, n);
    jsonAppendChar(&jx, ':');
    jsonAppendValue(&jx, argv[i+1]);
  }
  jsonAppendChar(&jx, '}');
  jsonResult(&jx);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}